

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_compute_ttf_font_glyph_metrics
               (rf_ttf_font_info *font_info,int *codepoints,rf_int codepoints_count,
               rf_glyph_info *dst,rf_int dst_count)

{
  anon_struct_160_20_e7d3dea2_for_internal_stb_font_info *info;
  float scale_x;
  uchar *puVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ushort uVar7;
  int *piVar8;
  long lVar9;
  stbtt_fontinfo *stbtt_ctx;
  long in_FS_OFFSET;
  float in_XMM2_Da;
  float in_XMM3_Da;
  int end_y;
  int end_x;
  int begin_y;
  int begin_x;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  float local_38;
  float local_34;
  
  if ((((font_info != (rf_ttf_font_info *)0x0) && (codepoints_count <= dst_count)) &&
      (dst != (rf_glyph_info *)0x0)) && (font_info->valid != false)) {
    *(undefined8 *)(in_FS_OFFSET + -0x430) = 0;
    *(undefined8 *)(in_FS_OFFSET + -0x428) = 0;
    font_info->largest_glyph_size = 0;
    info = &font_info->internal_stb_font_info;
    lVar9 = 0;
    if (codepoints_count < 1) {
      codepoints_count = lVar9;
    }
    piVar8 = &dst->advance_x;
    for (; codepoints_count != lVar9; lVar9 = lVar9 + 1) {
      iVar4 = codepoints[lVar9];
      piVar8[-3] = iVar4;
      local_3c = 0;
      local_40 = 0;
      local_44 = 0;
      local_48 = 0;
      scale_x = font_info->scale_factor;
      iVar4 = stbtt_FindGlyphIndex((stbtt_fontinfo *)info,iVar4);
      stbtt_GetGlyphBitmapBoxSubpixel
                ((stbtt_fontinfo *)info,iVar4,scale_x,scale_x,in_XMM2_Da,in_XMM3_Da,&local_3c,
                 &local_40,&local_44,&local_48);
      iVar5 = local_44 - local_3c;
      piVar8[-5] = (int)(float)iVar5;
      local_34 = (float)(local_48 - local_40);
      piVar8[-4] = (int)local_34;
      piVar8[-2] = local_3c;
      local_38 = font_info->scale_factor;
      piVar8[-1] = (int)((float)font_info->ascent * local_38) + local_40;
      iVar6 = stbtt_FindGlyphIndex((stbtt_fontinfo *)info,piVar8[-3]);
      puVar1 = (font_info->internal_stb_font_info).data;
      uVar7 = *(ushort *)(puVar1 + (long)(font_info->internal_stb_font_info).hhea + 0x22) << 8 |
              *(ushort *)(puVar1 + (long)(font_info->internal_stb_font_info).hhea + 0x22) >> 8;
      iVar4 = (font_info->internal_stb_font_info).hmtx;
      lVar2 = (long)(iVar6 * 4) + 1 + (long)iVar4;
      if ((int)(uint)uVar7 <= iVar6) {
        lVar2 = (ulong)uVar7 * 4 + (long)iVar4 + -3;
      }
      lVar3 = (ulong)uVar7 * 4 + (long)iVar4 + -4;
      if (iVar6 < (int)(uint)uVar7) {
        lVar3 = (long)(iVar6 * 4) + (long)iVar4;
      }
      *piVar8 = (int)((float)(int)CONCAT11(puVar1[lVar3],puVar1[lVar2]) * local_38);
      iVar4 = (int)((float)iVar5 * local_34);
      if (font_info->largest_glyph_size < iVar4) {
        font_info->largest_glyph_size = iVar4;
      }
      piVar8 = piVar8 + 8;
    }
  }
  return;
}

Assistant:

RF_API void rf_compute_ttf_font_glyph_metrics(rf_ttf_font_info* font_info, const int* codepoints, rf_int codepoints_count, rf_glyph_info* dst, rf_int dst_count)
{
    if (font_info && font_info->valid)
    {
        if (dst && dst_count >= codepoints_count)
        {
            // The stbtt functions called here should not require any allocations
            RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

            font_info->largest_glyph_size = 0;

            float required_area = 0;

            // NOTE: Using simple packaging, one char after another
            for (rf_int i = 0; i < codepoints_count; i++)
            {
                stbtt_fontinfo* stbtt_ctx = (stbtt_fontinfo*) &font_info->internal_stb_font_info;

                dst[i].codepoint = codepoints[i];

                int begin_x = 0;
                int begin_y = 0;
                int end_x   = 0;
                int end_y   = 0;
                stbtt_GetCodepointBitmapBox(stbtt_ctx, dst[i].codepoint, font_info->scale_factor, font_info->scale_factor, &begin_x, &begin_y, &end_x, &end_y);

                dst[i].width  = end_x - begin_x;
                dst[i].height = end_y - begin_y;
                dst[i].offset_x = begin_x;
                dst[i].offset_y = begin_y;
                dst[i].offset_y += (int) ((float)font_info->ascent * font_info->scale_factor);

                stbtt_GetCodepointHMetrics(stbtt_ctx, dst[i].codepoint, &dst[i].advance_x, NULL);
                dst[i].advance_x *= font_info->scale_factor;

                const int char_size = dst[i].width * dst[i].height;
                if (char_size > font_info->largest_glyph_size) font_info->largest_glyph_size = char_size;
            }
        }
    }
}